

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O2

void helics::BrokerFactory::unregisterBroker(string_view name)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,&local_20,&local_61);
  bVar1 = gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::removeObject
                    ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,
                     &local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    local_40._8_8_ = 0;
    local_28 = std::
               _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:341:13)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<bool_(const_std::shared_ptr<helics::Broker>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerFactory.cpp:341:13)>
               ::_M_manager;
    local_40._M_unused._M_object = &local_20;
    gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::removeObject
              ((SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers,
               (function<bool_(const_std::shared_ptr<helics::Broker>_&)> *)&local_40);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  }
  return;
}

Assistant:

void unregisterBroker(std::string_view name)
{
    if (!searchableBrokers.removeObject(std::string(name))) {
        searchableBrokers.removeObject(
            [&name](auto& obj) { return (obj->getIdentifier() == name); });
    }
}